

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O0

optional<pbrt::ShapeSample> * __thiscall
pbrt::Triangle::Sample(Triangle *this,ShapeSampleContext *ctx,Point2f u)

{
  int *piVar1;
  Point3f *pPVar2;
  Normal3f *pNVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Point2<float> c;
  Point2<float> c_00;
  Point3<float> p_00;
  Vector3<float> v_00;
  Point2f uv_00;
  Point3<float> p_01;
  Point3<float> p_02;
  Point3<float> p_03;
  Tuple3<pbrt::Point3,_float> t;
  Tuple3<pbrt::Point3,_float> t_00;
  Point3<float> c_01;
  Tuple3<pbrt::Point3,_float> t_01;
  Point3<float> c_02;
  Point3<float> c_03;
  Point3<float> c_04;
  Point3<float> p_04;
  Point3<float> p_05;
  Normal3<float> c_05;
  Normal3<float> c_06;
  Vector3<float> w_00;
  Tuple3<pbrt::Point3,_float> t_02;
  Tuple3<pbrt::Point3,_float> t_03;
  Tuple3<pbrt::Point3,_float> t_04;
  Tuple3<pbrt::Point3,_float> t_05;
  Tuple3<pbrt::Point3,_float> t_06;
  Tuple3<pbrt::Point3,_float> t_07;
  Tuple3<pbrt::Point3,_float> t_08;
  Tuple3<pbrt::Normal3,_float> t_09;
  Tuple3<pbrt::Normal3,_float> t_10;
  Tuple3<pbrt::Normal3,_float> t_11;
  Vector3f e;
  Normal3f n_00;
  initializer_list<float> v_01;
  span<const_float> w_01;
  Vector3<float> v_02;
  Vector3<float> v_03;
  Vector3<float> v_04;
  Vector3<float> v_05;
  Vector3<float> v_06;
  Vector3<float> v_07;
  Vector3<float> v_08;
  Vector3<float> v_09;
  Vector3<float> v_10;
  Normal3<float> n_01;
  Point3f p_06;
  initializer_list<pbrt::Point3<float>_> v_11;
  initializer_list<pbrt::Point2<float>_> v_12;
  initializer_list<pbrt::Point2<float>_> v_13;
  Point2f p_07;
  Point3<float> p2_00;
  Normal3<float> n_02;
  Normal3<float> n_03;
  Normal3<float> n_04;
  Normal3<float> n_05;
  span<const_float> w_02;
  Normal3<float> n2;
  Point2f u_00;
  Point3<float> p1_00;
  Normal3<float> n_06;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Point2f u_01;
  Point3f p_08;
  Normal3<float> c_07;
  enable_if_t<std::is_floating_point_v<float>,_bool> eVar15;
  bool bVar16;
  TriangleMesh *pTVar17;
  ShapeSample *pSVar18;
  float *pfVar19;
  long in_RDX;
  long in_RSI;
  optional<pbrt::ShapeSample> *in_RDI;
  Float FVar20;
  float fVar21;
  type tVar22;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined1 in_ZMM0 [64];
  undefined1 auVar66 [56];
  undefined1 extraout_var [56];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 extraout_var_02 [56];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  float fVar67;
  float fVar68;
  Point3f PVar69;
  Vector3<float> VVar70;
  Vector3<float> VVar71;
  array<float,_3> aVar72;
  Point3<float> PVar73;
  Normal3<float> NVar74;
  Point2f uvSample;
  array<pbrt::Point2<float>,_3> uv;
  Normal3f ns;
  Normal3f n;
  Point3f p;
  Vector3f pError;
  Point3f pAbsSum;
  array<float,_3> b;
  Float triPDF;
  array<float,_4> w;
  Vector3f wi_1 [3];
  Point3f rp;
  Float pdf;
  Vector3f wi;
  optional<pbrt::ShapeSample> ss;
  Float solidAngle;
  Point3f p2;
  Point3f p1;
  Point3f p0;
  int *v;
  TriangleMesh *mesh;
  undefined8 in_stack_fffffffffffff098;
  Tuple2<pbrt::Point2,_float> t_12;
  undefined4 in_stack_fffffffffffff0a0;
  undefined4 in_stack_fffffffffffff0a4;
  undefined4 in_stack_fffffffffffff0a8;
  float fVar75;
  undefined4 in_stack_fffffffffffff0ac;
  float fVar76;
  float in_stack_fffffffffffff0b0;
  float in_stack_fffffffffffff0b4;
  float fVar77;
  undefined4 in_stack_fffffffffffff0c0;
  undefined4 in_stack_fffffffffffff0c4;
  array<pbrt::Point2<float>,_3> *this_00;
  float in_stack_fffffffffffff0c8;
  undefined4 uVar78;
  float in_stack_fffffffffffff0cc;
  undefined4 uVar79;
  float in_stack_fffffffffffff0d0;
  undefined4 in_stack_fffffffffffff0d4;
  undefined4 in_stack_fffffffffffff0d8;
  float in_stack_fffffffffffff0dc;
  Interaction *in_stack_fffffffffffff0e0;
  float in_stack_fffffffffffff0e8;
  float in_stack_fffffffffffff0ec;
  array<float,_3> *this_01;
  float in_stack_fffffffffffff0f0;
  undefined4 in_stack_fffffffffffff0f4;
  undefined4 in_stack_fffffffffffff0f8;
  undefined4 in_stack_fffffffffffff0fc;
  float in_stack_fffffffffffff100;
  undefined4 in_stack_fffffffffffff104;
  float in_stack_fffffffffffff108;
  float in_stack_fffffffffffff10c;
  undefined4 uVar80;
  undefined8 in_stack_fffffffffffff118;
  float in_stack_fffffffffffff120;
  undefined4 in_stack_fffffffffffff124;
  undefined1 *puVar81;
  undefined4 uStack_ed4;
  Triangle *in_stack_fffffffffffff260;
  undefined8 in_stack_fffffffffffff278;
  float in_stack_fffffffffffff280;
  undefined1 local_c88 [24];
  undefined1 *local_c70;
  undefined8 local_c68;
  Tuple2<pbrt::Point2,_float> local_c60;
  Tuple2<pbrt::Point2,_float> local_c58;
  Tuple2<pbrt::Point2,_float> local_c50;
  Tuple2<pbrt::Point2,_float> *local_c48;
  undefined8 local_c40;
  array<pbrt::Point2<float>,_3> local_c38;
  undefined8 local_c20;
  float local_c18;
  undefined8 local_c10;
  float local_c08;
  undefined8 local_c00;
  float local_bf8;
  undefined8 local_bf0;
  float local_be8;
  undefined8 local_be0;
  float local_bd8;
  undefined8 local_bd4;
  float local_bcc;
  undefined8 local_bc8;
  float local_bc0;
  undefined8 local_bb8;
  float local_bb0;
  undefined8 local_ba8;
  float local_ba0;
  undefined8 local_b98;
  float local_b90;
  undefined8 local_b88;
  float local_b80;
  undefined8 local_b78;
  float local_b70;
  undefined8 local_b68;
  float local_b60;
  undefined8 local_b58;
  float local_b50;
  undefined8 local_b48;
  float local_b40;
  undefined8 local_b38;
  float local_b30;
  undefined8 local_b28;
  float local_b20;
  undefined8 local_b18;
  float local_b10;
  undefined8 local_b08;
  float local_b00;
  undefined8 local_af8;
  float local_af0;
  undefined8 local_ae8;
  float local_ae0;
  undefined8 local_ad8;
  float local_ad0;
  undefined8 local_ac8;
  float local_ac0;
  undefined8 local_ab8;
  float local_ab0;
  undefined8 local_aa8;
  float local_aa0;
  undefined8 local_a98;
  undefined4 local_a90;
  undefined8 local_a88;
  float local_a80;
  undefined8 local_a78;
  float local_a70;
  undefined8 local_a68;
  float local_a60;
  undefined8 local_a58;
  float local_a50;
  undefined8 local_a48;
  float local_a40;
  undefined8 local_a38;
  float local_a30;
  undefined8 local_a28;
  float local_a20;
  undefined8 local_a18;
  float local_a10;
  undefined8 local_a08;
  float local_a00;
  undefined8 local_9f8;
  float local_9f0;
  undefined8 local_9e8;
  float local_9e0;
  undefined8 local_9d8;
  float local_9d0;
  undefined8 local_9c8;
  float local_9c0;
  undefined8 local_9b8;
  undefined4 local_9b0;
  undefined8 local_9ac;
  float local_9a4;
  undefined8 local_9a0;
  float local_998;
  undefined8 local_990;
  float local_988;
  undefined8 local_980;
  float local_978;
  undefined8 local_970;
  float local_968;
  undefined8 local_960;
  float local_958;
  undefined8 local_950;
  float local_948;
  undefined8 local_940;
  float local_938;
  undefined8 local_930;
  float local_928;
  undefined8 local_920;
  float local_918;
  undefined8 local_910;
  float local_908;
  undefined8 local_900;
  float local_8f8;
  undefined8 local_8f0;
  float local_8e8;
  undefined8 local_8e0;
  float local_8d8;
  undefined8 local_8d0;
  float local_8c8;
  undefined8 local_8c0;
  float local_8b8;
  undefined8 local_8b0;
  float local_8a8;
  undefined8 local_8a0;
  float local_898;
  undefined8 local_890;
  float local_888;
  undefined8 local_880;
  float local_878;
  undefined8 local_870;
  float local_868;
  undefined8 local_860;
  float local_858;
  undefined8 local_850;
  float local_848;
  undefined8 local_840;
  float local_838;
  undefined8 local_828;
  float local_820;
  undefined8 local_818;
  float local_810;
  undefined8 local_808;
  float local_800;
  undefined8 local_7f8;
  float local_7f0;
  undefined8 local_7e8;
  float local_7e0;
  undefined8 local_7d8;
  float local_7d0;
  undefined8 local_7c8;
  float local_7c0;
  undefined8 local_7b8;
  float local_7b0;
  undefined8 local_7a8;
  float local_7a0;
  undefined8 local_798;
  float local_790;
  undefined8 local_788;
  float local_780;
  undefined8 local_778;
  float local_770;
  undefined8 local_768;
  float local_760;
  undefined8 local_758;
  float local_750;
  undefined8 local_748;
  float local_740;
  undefined8 local_738;
  float local_730;
  undefined8 local_728;
  undefined4 in_stack_fffffffffffff8e0;
  undefined4 in_stack_fffffffffffff8e4;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffff8e8;
  undefined8 local_600;
  float local_5f8;
  undefined8 local_5f4;
  float local_5ec;
  undefined8 local_5e8;
  float local_5e0;
  undefined8 *local_5d8;
  undefined8 local_5d0;
  array<float,_3> local_5a0;
  float local_594;
  undefined8 local_580;
  undefined8 local_568;
  undefined8 local_560;
  undefined8 local_558;
  float local_550;
  undefined8 local_548;
  undefined4 local_540;
  undefined8 local_538;
  float local_530;
  undefined8 local_528;
  undefined4 local_520;
  type local_518;
  float local_514;
  undefined8 local_510;
  float local_508;
  undefined8 local_500;
  undefined4 local_4f8;
  undefined8 local_4f0;
  float local_4e8;
  undefined8 local_4e0;
  undefined4 local_4d8;
  type local_4d0;
  float local_4cc;
  undefined8 local_4c8;
  float local_4c0;
  undefined8 local_4b8;
  undefined4 local_4b0;
  undefined8 local_4a8;
  float local_4a0;
  undefined8 local_498;
  undefined4 local_490;
  type local_488;
  float local_484;
  undefined8 local_480;
  float local_478;
  undefined8 local_470;
  undefined4 local_468;
  undefined8 local_460;
  float local_458;
  undefined8 local_450;
  undefined4 local_448;
  type local_440;
  float local_43c;
  float local_438;
  float local_434;
  float local_430;
  float local_42c;
  float *local_428;
  undefined8 local_420;
  undefined1 local_418 [16];
  undefined8 local_408;
  float local_400;
  array<pbrt::Point3<float>,_3> *local_3f8;
  float in_stack_fffffffffffffc10;
  undefined4 in_stack_fffffffffffffc14;
  array<pbrt::Point3<float>,_3> *in_stack_fffffffffffffc18;
  float in_stack_fffffffffffffc20;
  float in_stack_fffffffffffffc24;
  undefined8 in_stack_fffffffffffffc38;
  float in_stack_fffffffffffffc40;
  undefined8 local_290;
  float local_288;
  undefined1 auVar23 [64];
  undefined1 auVar28 [64];
  undefined1 auVar35 [64];
  undefined1 auVar52 [64];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  
  auVar66 = in_ZMM0._8_56_;
  uVar64 = vmovlpd_avx(in_ZMM0._0_16_);
  pTVar17 = GetMesh((Triangle *)0x5999d0);
  piVar1 = pTVar17->vertexIndices + *(int *)(in_RSI + 4) * 3;
  fVar21 = pTVar17->p[*piVar1].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar2 = pTVar17->p + *piVar1;
  uVar65._0_4_ = (pPVar2->super_Tuple3<pbrt::Point3,_float>).x;
  uVar65._4_4_ = (pPVar2->super_Tuple3<pbrt::Point3,_float>).y;
  fVar77 = pTVar17->p[piVar1[1]].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar2 = pTVar17->p + piVar1[1];
  uVar7._0_4_ = (pPVar2->super_Tuple3<pbrt::Point3,_float>).x;
  uVar7._4_4_ = (pPVar2->super_Tuple3<pbrt::Point3,_float>).y;
  fVar75 = pTVar17->p[piVar1[2]].super_Tuple3<pbrt::Point3,_float>.z;
  pPVar2 = pTVar17->p + piVar1[2];
  uVar8._0_4_ = (pPVar2->super_Tuple3<pbrt::Point3,_float>).x;
  uVar8._4_4_ = (pPVar2->super_Tuple3<pbrt::Point3,_float>).y;
  PVar69 = ShapeSampleContext::p((ShapeSampleContext *)in_stack_fffffffffffff0e0);
  auVar23._0_8_ = PVar69.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar23._8_56_ = auVar66;
  vmovlpd_avx(auVar23._0_16_);
  PVar69.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff280;
  PVar69.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffff278;
  PVar69.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)in_stack_fffffffffffff278 >> 0x20);
  FVar20 = SolidAngle(in_stack_fffffffffffff260,PVar69);
  if ((FVar20 < 0.0003) || (6.22 < FVar20)) {
    Sample((Triangle *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
           (Point2f)in_stack_fffffffffffff8e8);
    FVar20 = *(Float *)(in_RDX + 0x30);
    pSVar18 = pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x599ba1)
    ;
    uVar64 = 0;
    (pSVar18->intr).time = FVar20;
    pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x599bce);
    PVar69 = Interaction::p(in_stack_fffffffffffff0e0);
    uVar65 = 0;
    auVar14._8_8_ = uVar64;
    auVar14._0_8_ = PVar69.super_Tuple3<pbrt::Point3,_float>._0_8_;
    vmovlpd_avx(auVar14);
    PVar69 = ShapeSampleContext::p((ShapeSampleContext *)in_stack_fffffffffffff0e0);
    auVar13._8_8_ = uVar65;
    auVar13._0_8_ = PVar69.super_Tuple3<pbrt::Point3,_float>._0_8_;
    vmovlpd_avx(auVar13);
    uVar64 = 0;
    PVar73.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff0c4;
    PVar73.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff0c0;
    PVar73.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff0c8;
    VVar70 = Point3<float>::operator-
                       ((Point3<float> *)
                        CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),PVar73);
    auVar12._8_8_ = uVar64;
    auVar12._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    vmovlpd_avx(auVar12);
    VVar70.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff0b0;
    VVar70.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff0ac;
    VVar70.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff0b4;
    fVar21 = LengthSquared<float>(VVar70);
    if ((fVar21 != 0.0) || (NAN(fVar21))) {
      uVar64 = 0;
      v_07.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff0ec;
      v_07.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff0e8;
      v_07.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff0f0;
      VVar70 = Normalize<float>(v_07);
      uVar65 = 0;
      auVar11._8_8_ = uVar64;
      auVar11._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar11);
      pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x599ecf);
      VVar70 = Tuple3<pbrt::Vector3,_float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffff0a4,in_stack_fffffffffffff0a0));
      auVar10._8_8_ = uVar65;
      auVar10._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar10);
      NVar74.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffff0fc;
      NVar74.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffff0f8;
      NVar74.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff100;
      VVar71.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff0e0;
      VVar71.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff0dc;
      tVar22 = AbsDot<float>(NVar74,VVar71);
      auVar66 = extraout_var;
      PVar69 = ShapeSampleContext::p((ShapeSampleContext *)in_stack_fffffffffffff0e0);
      auVar24._0_8_ = PVar69.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar24._8_56_ = auVar66;
      uVar64 = 0;
      vmovlpd_avx(auVar24._0_16_);
      pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x59a03a);
      PVar69 = Interaction::p(in_stack_fffffffffffff0e0);
      auVar9._8_8_ = uVar64;
      auVar9._0_8_ = PVar69.super_Tuple3<pbrt::Point3,_float>._0_8_;
      vmovlpd_avx(auVar9);
      p1_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff120;
      p1_00.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffff118;
      p1_00.super_Tuple3<pbrt::Point3,_float>.y =
           (float)(int)((ulong)in_stack_fffffffffffff118 >> 0x20);
      p2_00.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff0fc;
      p2_00.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff0f8;
      p2_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff100;
      fVar21 = DistanceSquared<float>(p1_00,p2_00);
      pSVar18 = pstd::optional<pbrt::ShapeSample>::operator->
                          ((optional<pbrt::ShapeSample> *)0x59a143);
      pSVar18->pdf = pSVar18->pdf / (tVar22 / fVar21);
      pstd::optional<pbrt::ShapeSample>::operator->((optional<pbrt::ShapeSample> *)0x59a179);
      eVar15 = IsInf<float>(0.0);
      if (eVar15) {
        memset(in_RDI,0,0x60);
        pstd::optional<pbrt::ShapeSample>::optional(in_RDI);
      }
      else {
        pstd::optional<pbrt::ShapeSample>::optional
                  ((optional<pbrt::ShapeSample> *)
                   CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
                   (optional<pbrt::ShapeSample> *)
                   CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8));
      }
    }
    else {
      memset(in_RDI,0,0x60);
      pstd::optional<pbrt::ShapeSample>::optional(in_RDI);
    }
    pstd::optional<pbrt::ShapeSample>::~optional((optional<pbrt::ShapeSample> *)0x59a208);
  }
  else {
    fVar76 = (float)(in_RDX + 0x24);
    uStack_ed4 = (undefined4)((ulong)(in_RDX + 0x24) >> 0x20);
    Normal3<float>::Normal3
              ((Normal3<float> *)CONCAT44(in_stack_fffffffffffff0a4,in_stack_fffffffffffff0a0),
               (float)((ulong)in_stack_fffffffffffff098 >> 0x20),(float)in_stack_fffffffffffff098,
               0.0);
    c_07.super_Tuple3<pbrt::Normal3,_float>.z = local_288;
    c_07.super_Tuple3<pbrt::Normal3,_float>._0_8_ = local_290;
    auVar66 = (undefined1  [56])0x0;
    bVar16 = Tuple3<pbrt::Normal3,_float>::operator!=
                       ((Tuple3<pbrt::Normal3,_float> *)CONCAT44(uStack_ed4,fVar76),c_07);
    puVar81 = (undefined1 *)CONCAT44(in_stack_fffffffffffff124,in_stack_fffffffffffff120);
    if (bVar16) {
      PVar69 = ShapeSampleContext::p((ShapeSampleContext *)in_stack_fffffffffffff0e0);
      in_stack_fffffffffffffc40 = PVar69.super_Tuple3<pbrt::Point3,_float>.z;
      auVar25._0_8_ = PVar69.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar25._8_56_ = auVar66;
      in_stack_fffffffffffffc38 = vmovlpd_avx(auVar25._0_16_);
      auVar66 = ZEXT856(0);
      p_01.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff0c4;
      p_01.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff0c0;
      p_01.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff0c8;
      VVar70 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),p_01);
      auVar26._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar26._8_56_ = auVar66;
      vmovlpd_avx(auVar26._0_16_);
      auVar66 = ZEXT856(0);
      v_08.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff0ec;
      v_08.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff0e8;
      v_08.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff0f0;
      VVar70 = Normalize<float>(v_08);
      auVar27._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar27._8_56_ = auVar66;
      uVar4 = vmovlpd_avx(auVar27._0_16_);
      auVar66 = ZEXT856(0);
      p_02.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff0c4;
      p_02.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff0c0;
      p_02.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff0c8;
      VVar71 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),p_02);
      auVar28._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar28._8_56_ = auVar66;
      vmovlpd_avx(auVar28._0_16_);
      auVar66 = ZEXT856(0);
      v_09.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff0ec;
      v_09.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff0e8;
      v_09.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff0f0;
      VVar71 = Normalize<float>(v_09);
      fVar67 = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar29._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar29._8_56_ = auVar66;
      uVar5 = vmovlpd_avx(auVar29._0_16_);
      auVar66 = ZEXT856(0);
      p_03.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff0c4;
      p_03.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff0c0;
      p_03.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff0c8;
      VVar71 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),p_03);
      in_stack_fffffffffffffc10 = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar30._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar30._8_56_ = auVar66;
      local_3f8 = (array<pbrt::Point3<float>,_3> *)vmovlpd_avx(auVar30._0_16_);
      auVar66 = ZEXT856(0);
      v_10.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff0ec;
      v_10.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff0e8;
      v_10.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff0f0;
      in_stack_fffffffffffffc18 = local_3f8;
      in_stack_fffffffffffffc20 = in_stack_fffffffffffffc10;
      VVar71 = Normalize<float>(v_10);
      fVar68 = VVar71.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar31._0_8_ = VVar71.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar31._8_56_ = auVar66;
      uVar6 = vmovlpd_avx(auVar31._0_16_);
      local_43c = 0.01;
      local_468 = *(undefined4 *)(in_RDX + 0x2c);
      local_470 = *(undefined8 *)(in_RDX + 0x24);
      n_02.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffff0fc;
      n_02.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffff0f8;
      n_02.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff100;
      v_02.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff0e0;
      v_02.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff0dc;
      local_480 = uVar5;
      local_478 = fVar67;
      local_460 = uVar5;
      local_458 = fVar67;
      local_450 = local_470;
      local_448 = local_468;
      local_408 = uVar6;
      local_400 = fVar68;
      local_440 = AbsDot<float>(n_02,v_02);
      pfVar19 = std::max<float>(&local_43c,&local_440);
      local_438 = *pfVar19;
      local_484 = 0.01;
      local_4b0 = *(undefined4 *)(in_RDX + 0x2c);
      local_4b8 = *(undefined8 *)(in_RDX + 0x24);
      n_03.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffff0fc;
      n_03.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffff0f8;
      n_03.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff100;
      v_03.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff0e0;
      v_03.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff0dc;
      local_4c8 = uVar5;
      local_4c0 = fVar67;
      local_4a8 = uVar5;
      local_4a0 = fVar67;
      local_498 = local_4b8;
      local_490 = local_4b0;
      local_488 = AbsDot<float>(n_03,v_03);
      pfVar19 = std::max<float>(&local_484,&local_488);
      local_434 = *pfVar19;
      local_4cc = 0.01;
      local_4f8 = *(undefined4 *)(in_RDX + 0x2c);
      local_500 = *(undefined8 *)(in_RDX + 0x24);
      n_04.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffff0fc;
      n_04.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffff0f8;
      n_04.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff100;
      v_04.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff0e0;
      v_04.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff0dc;
      local_510 = uVar4;
      local_508 = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
      local_4f0 = uVar4;
      local_4e8 = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
      local_4e0 = local_500;
      local_4d8 = local_4f8;
      local_4d0 = AbsDot<float>(n_04,v_04);
      pfVar19 = std::max<float>(&local_4cc,&local_4d0);
      local_430 = *pfVar19;
      local_514 = 0.01;
      local_540 = *(undefined4 *)(in_RDX + 0x2c);
      local_548 = *(undefined8 *)(in_RDX + 0x24);
      n_05.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffff0fc;
      n_05.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffff0f8;
      n_05.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff100;
      v_05.super_Tuple3<pbrt::Vector3,_float>._4_8_ = in_stack_fffffffffffff0e0;
      v_05.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffff0dc;
      local_558 = uVar6;
      local_550 = fVar68;
      local_538 = uVar6;
      local_530 = fVar68;
      local_528 = local_548;
      local_520 = local_540;
      local_518 = AbsDot<float>(n_05,v_05);
      pfVar19 = std::max<float>(&local_514,&local_518);
      local_42c = *pfVar19;
      local_428 = &local_438;
      local_420 = 4;
      puVar81 = local_418;
      v_01._M_array._4_4_ = in_stack_fffffffffffff0dc;
      v_01._M_array._0_4_ = in_stack_fffffffffffff0d8;
      v_01._M_len = (size_type)in_stack_fffffffffffff0e0;
      pstd::array<float,_4>::array
                ((array<float,_4> *)CONCAT44(in_stack_fffffffffffff0d4,in_stack_fffffffffffff0d0),
                 v_01);
      local_568 = uVar64;
      pstd::span<float_const>::span<pstd::array<float,4>,void,pstd::array<float,4>>
                ((span<const_float> *)CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
                 (array<float,_4> *)CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8));
      u_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff10c;
      u_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff108;
      w_02.ptr._4_4_ = in_stack_fffffffffffff0fc;
      w_02.ptr._0_4_ = in_stack_fffffffffffff0f8;
      w_02.n._0_4_ = in_stack_fffffffffffff100;
      w_02.n._4_4_ = in_stack_fffffffffffff104;
      auVar32._0_8_ = SampleBilinear(u_00,w_02);
      auVar32._8_56_ = extraout_var_00;
      local_580 = vmovlpd_avx(auVar32._0_16_);
      local_560 = local_580;
      pstd::span<float_const>::span<pstd::array<float,4>,void,pstd::array<float,4>>
                ((span<const_float> *)CONCAT44(in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0),
                 (array<float,_4> *)CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8));
      p_07.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff0f0;
      p_07.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff0ec;
      w_01.ptr._4_4_ = in_stack_fffffffffffff0dc;
      w_01.ptr._0_4_ = in_stack_fffffffffffff0d8;
      w_01.n = (size_t)in_stack_fffffffffffff0e0;
      BilinearPDF(p_07,w_01);
      auVar66 = extraout_var_01;
    }
    local_5d8 = &local_600;
    local_5d0 = 3;
    v_11._M_array._4_4_ = in_stack_fffffffffffff0ec;
    v_11._M_array._0_4_ = in_stack_fffffffffffff0e8;
    v_11._M_len._0_4_ = in_stack_fffffffffffff0f0;
    v_11._M_len._4_4_ = in_stack_fffffffffffff0f4;
    local_600 = uVar65;
    local_5f8 = fVar21;
    local_5f4 = uVar7;
    local_5ec = fVar77;
    local_5e8 = uVar8;
    local_5e0 = fVar75;
    pstd::array<pbrt::Point3<float>,_3>::array
              ((array<pbrt::Point3<float>,_3> *)in_stack_fffffffffffff0e0,v_11);
    PVar69 = ShapeSampleContext::p((ShapeSampleContext *)in_stack_fffffffffffff0e0);
    auVar33._0_8_ = PVar69.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar33._8_56_ = auVar66;
    vmovlpd_avx(auVar33._0_16_);
    auVar66 = ZEXT856(0);
    p_08.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffffc40;
    p_08.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)in_stack_fffffffffffffc38;
    p_08.super_Tuple3<pbrt::Point3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffc38 >> 0x20);
    u_01.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffc24;
    u_01.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffc20;
    aVar72 = SampleSphericalTriangle
                       (in_stack_fffffffffffffc18,p_08,u_01,
                        (Float *)CONCAT44(in_stack_fffffffffffffc14,in_stack_fffffffffffffc10));
    local_5a0.values[2] = aVar72.values[2];
    auVar34._0_8_ = aVar72.values._0_8_;
    auVar34._8_56_ = auVar66;
    local_5a0.values._0_8_ = vmovlpd_avx(auVar34._0_16_);
    if ((local_594 != 0.0) || (NAN(local_594))) {
      uVar78 = 0;
      uVar79 = 0;
      pstd::array<float,_3>::operator[](&local_5a0,0);
      auVar66 = (undefined1  [56])0x0;
      t_02.y = in_stack_fffffffffffff0cc;
      t_02.x = in_stack_fffffffffffff0c8;
      t_02.z = in_stack_fffffffffffff0d0;
      PVar73 = pbrt::operator*(in_stack_fffffffffffff0b4,t_02);
      auVar35._0_8_ = PVar73.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar35._8_56_ = auVar66;
      vmovlpd_avx(auVar35._0_16_);
      auVar66 = ZEXT856(0);
      t.y = (float)in_stack_fffffffffffff0c4;
      t.x = (float)in_stack_fffffffffffff0c0;
      t.z = in_stack_fffffffffffff0c8;
      PVar73 = Abs<pbrt::Point3,float>(t);
      auVar36._0_8_ = PVar73.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar36._8_56_ = auVar66;
      vmovlpd_avx(auVar36._0_16_);
      fVar68 = 1.4013e-45;
      uVar80 = 0;
      pstd::array<float,_3>::operator[](&local_5a0,1);
      auVar66 = (undefined1  [56])0x0;
      t_03.y = in_stack_fffffffffffff0cc;
      t_03.x = in_stack_fffffffffffff0c8;
      t_03.z = in_stack_fffffffffffff0d0;
      local_738 = uVar7;
      local_730 = fVar77;
      local_728 = uVar7;
      PVar73 = pbrt::operator*(in_stack_fffffffffffff0b4,t_03);
      local_750 = PVar73.super_Tuple3<pbrt::Point3,_float>.z;
      auVar37._0_8_ = PVar73.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar37._8_56_ = auVar66;
      local_758 = vmovlpd_avx(auVar37._0_16_);
      auVar66 = ZEXT856(0);
      t_00.y = (float)in_stack_fffffffffffff0c4;
      t_00.x = (float)in_stack_fffffffffffff0c0;
      t_00.z = in_stack_fffffffffffff0c8;
      local_748 = local_758;
      local_740 = local_750;
      PVar73 = Abs<pbrt::Point3,float>(t_00);
      local_770 = PVar73.super_Tuple3<pbrt::Point3,_float>.z;
      auVar38._0_8_ = PVar73.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar38._8_56_ = auVar66;
      local_778 = vmovlpd_avx(auVar38._0_16_);
      auVar66 = ZEXT856(0);
      c_01.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff0c4;
      c_01.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff0c0;
      c_01.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff0c8;
      local_768 = local_778;
      local_760 = local_770;
      PVar73 = Tuple3<pbrt::Point3,float>::operator+
                         ((Tuple3<pbrt::Point3,_float> *)
                          CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),c_01);
      local_780 = PVar73.super_Tuple3<pbrt::Point3,_float>.z;
      auVar39._0_8_ = PVar73.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar39._8_56_ = auVar66;
      local_788 = vmovlpd_avx(auVar39._0_16_);
      pstd::array<float,_3>::operator[](&local_5a0,CONCAT44(uVar79,uVar78));
      pstd::array<float,_3>::operator[](&local_5a0,CONCAT44(uVar80,fVar68));
      auVar66 = (undefined1  [56])0x0;
      t_04.y = in_stack_fffffffffffff0cc;
      t_04.x = in_stack_fffffffffffff0c8;
      t_04.z = in_stack_fffffffffffff0d0;
      local_7d8 = uVar8;
      local_7d0 = fVar75;
      local_7c8 = uVar8;
      local_7c0 = fVar75;
      PVar73 = pbrt::operator*(in_stack_fffffffffffff0b4,t_04);
      local_7f0 = PVar73.super_Tuple3<pbrt::Point3,_float>.z;
      auVar40._0_8_ = PVar73.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar40._8_56_ = auVar66;
      local_7f8 = vmovlpd_avx(auVar40._0_16_);
      auVar66 = ZEXT856(0);
      t_01.y = (float)in_stack_fffffffffffff0c4;
      t_01.x = (float)in_stack_fffffffffffff0c0;
      t_01.z = in_stack_fffffffffffff0c8;
      local_7e8 = local_7f8;
      local_7e0 = local_7f0;
      local_7b8 = local_7f8;
      local_7b0 = local_7f0;
      local_7a8 = local_7f8;
      local_7a0 = local_7f0;
      PVar73 = Abs<pbrt::Point3,float>(t_01);
      local_810 = PVar73.super_Tuple3<pbrt::Point3,_float>.z;
      auVar41._0_8_ = PVar73.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar41._8_56_ = auVar66;
      local_818 = vmovlpd_avx(auVar41._0_16_);
      auVar66 = ZEXT856(0);
      c_02.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff0c4;
      c_02.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff0c0;
      c_02.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff0c8;
      local_808 = local_818;
      local_800 = local_810;
      local_798 = local_818;
      local_790 = local_810;
      PVar73 = Tuple3<pbrt::Point3,float>::operator+
                         ((Tuple3<pbrt::Point3,_float> *)
                          CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),c_02);
      fVar67 = PVar73.super_Tuple3<pbrt::Point3,_float>.z;
      auVar42._0_8_ = PVar73.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar42._8_56_ = auVar66;
      uVar64 = vmovlpd_avx(auVar42._0_16_);
      local_828 = uVar64;
      local_820 = fVar67;
      gamma(auVar42._0_8_);
      t_05.y = in_stack_fffffffffffff0cc;
      t_05.x = in_stack_fffffffffffff0c8;
      t_05.z = in_stack_fffffffffffff0d0;
      auVar66 = extraout_var_02;
      local_860 = uVar64;
      local_858 = fVar67;
      local_850 = uVar64;
      local_848 = fVar67;
      PVar73 = pbrt::operator*(in_stack_fffffffffffff0b4,t_05);
      local_878 = PVar73.super_Tuple3<pbrt::Point3,_float>.z;
      auVar43._0_8_ = PVar73.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar43._8_56_ = auVar66;
      local_880 = vmovlpd_avx(auVar43._0_16_);
      p_00.super_Tuple3<pbrt::Point3,_float>.y = in_stack_fffffffffffff0b0;
      p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff0ac;
      p_00.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff0b4;
      local_870 = local_880;
      local_868 = local_878;
      local_840 = local_880;
      local_838 = local_878;
      Vector3<float>::Vector3<float>((Vector3<float> *)0x59b0ce,p_00);
      pstd::array<float,_3>::operator[](&local_5a0,CONCAT44(uVar79,uVar78));
      auVar66 = (undefined1  [56])0x0;
      t_06.y = in_stack_fffffffffffff0cc;
      t_06.x = in_stack_fffffffffffff0c8;
      t_06.z = in_stack_fffffffffffff0d0;
      local_8d0 = uVar65;
      local_8c8 = fVar21;
      local_8c0 = uVar65;
      local_8b8 = fVar21;
      PVar73 = pbrt::operator*(in_stack_fffffffffffff0b4,t_06);
      local_8d8 = PVar73.super_Tuple3<pbrt::Point3,_float>.z;
      auVar44._0_8_ = PVar73.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar44._8_56_ = auVar66;
      local_8e0 = vmovlpd_avx(auVar44._0_16_);
      local_8b0 = local_8e0;
      local_8a8 = local_8d8;
      pstd::array<float,_3>::operator[](&local_5a0,CONCAT44(uVar80,fVar68));
      auVar66 = (undefined1  [56])0x0;
      t_07.y = in_stack_fffffffffffff0cc;
      t_07.x = in_stack_fffffffffffff0c8;
      t_07.z = in_stack_fffffffffffff0d0;
      local_910 = uVar7;
      local_908 = fVar77;
      local_900 = uVar7;
      local_8f8 = fVar77;
      PVar73 = pbrt::operator*(in_stack_fffffffffffff0b4,t_07);
      local_928 = PVar73.super_Tuple3<pbrt::Point3,_float>.z;
      auVar45._0_8_ = PVar73.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar45._8_56_ = auVar66;
      local_930 = vmovlpd_avx(auVar45._0_16_);
      auVar66 = ZEXT856(0);
      c_03.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff0c4;
      c_03.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff0c0;
      c_03.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff0c8;
      local_920 = local_930;
      local_918 = local_928;
      local_8f0 = local_930;
      local_8e8 = local_928;
      PVar73 = Tuple3<pbrt::Point3,float>::operator+
                         ((Tuple3<pbrt::Point3,_float> *)
                          CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),c_03);
      local_938 = PVar73.super_Tuple3<pbrt::Point3,_float>.z;
      auVar46._0_8_ = PVar73.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar46._8_56_ = auVar66;
      local_940 = vmovlpd_avx(auVar46._0_16_);
      local_8a0 = local_940;
      local_898 = local_938;
      pstd::array<float,_3>::operator[](&local_5a0,2);
      auVar66 = (undefined1  [56])0x0;
      t_08.y = in_stack_fffffffffffff0cc;
      t_08.x = in_stack_fffffffffffff0c8;
      t_08.z = in_stack_fffffffffffff0d0;
      local_970 = uVar8;
      local_968 = fVar75;
      local_960 = uVar8;
      local_958 = fVar75;
      PVar73 = pbrt::operator*(in_stack_fffffffffffff0b4,t_08);
      local_988 = PVar73.super_Tuple3<pbrt::Point3,_float>.z;
      auVar47._0_8_ = PVar73.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar47._8_56_ = auVar66;
      local_990 = vmovlpd_avx(auVar47._0_16_);
      auVar66 = ZEXT856(0);
      c_04.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff0c4;
      c_04.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff0c0;
      c_04.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff0c8;
      local_980 = local_990;
      local_978 = local_988;
      local_950 = local_990;
      local_948 = local_988;
      PVar73 = Tuple3<pbrt::Point3,float>::operator+
                         ((Tuple3<pbrt::Point3,_float> *)
                          CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),c_04);
      local_998 = PVar73.super_Tuple3<pbrt::Point3,_float>.z;
      auVar48._0_8_ = PVar73.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar48._8_56_ = auVar66;
      local_9a0 = vmovlpd_avx(auVar48._0_16_);
      auVar66 = ZEXT856(0);
      p_04.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff0c4;
      p_04.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff0c0;
      p_04.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff0c8;
      local_9f8 = uVar65;
      local_9f0 = fVar21;
      local_9e8 = uVar65;
      local_9e0 = fVar21;
      local_890 = local_9a0;
      local_888 = local_998;
      VVar70 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),p_04);
      local_a00 = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar49._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar49._8_56_ = auVar66;
      local_a08 = vmovlpd_avx(auVar49._0_16_);
      auVar66 = ZEXT856(0);
      p_05.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_fffffffffffff0c4;
      p_05.super_Tuple3<pbrt::Point3,_float>.x = (float)in_stack_fffffffffffff0c0;
      p_05.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff0c8;
      local_a38 = uVar65;
      local_a30 = fVar21;
      local_a28 = uVar65;
      local_a20 = fVar21;
      local_9d8 = local_a08;
      local_9d0 = local_a00;
      VVar70 = Point3<float>::operator-
                         ((Point3<float> *)
                          CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),p_05);
      local_a60 = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar50._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar50._8_56_ = auVar66;
      local_a68 = vmovlpd_avx(auVar50._0_16_);
      local_a50 = local_9d0;
      local_a58 = local_9d8;
      auVar66 = ZEXT856(0);
      v_06.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff0e8;
      v_06.super_Tuple3<pbrt::Vector3,_float>._0_8_ = in_stack_fffffffffffff0e0;
      w_00.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff0c8;
      w_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff0c4;
      w_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff0cc;
      local_a48 = local_a68;
      local_a40 = local_a60;
      local_a18 = local_a68;
      local_a10 = local_a60;
      VVar70 = Cross<float>(v_06,w_00);
      local_a80 = VVar70.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar51._0_8_ = VVar70.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar51._8_56_ = auVar66;
      local_a88 = vmovlpd_avx(auVar51._0_16_);
      v_00.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffff0b0;
      v_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffff0ac;
      v_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff0b4;
      local_a78 = local_a88;
      local_a70 = local_a80;
      local_9c8 = local_a88;
      local_9c0 = local_a80;
      Normal3<float>::Normal3<float>((Normal3<float> *)0x59b552,v_00);
      local_a90 = local_9b0;
      local_a98 = local_9b8;
      auVar66 = ZEXT856(0);
      n_01.super_Tuple3<pbrt::Normal3,_float>.y = in_stack_fffffffffffff0ec;
      n_01.super_Tuple3<pbrt::Normal3,_float>.x = in_stack_fffffffffffff0e8;
      n_01.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff0f0;
      NVar74 = Normalize<float>(n_01);
      local_aa0 = NVar74.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar52._0_8_ = NVar74.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar52._8_56_ = auVar66;
      local_aa8 = vmovlpd_avx(auVar52._0_16_);
      local_9ac = local_aa8;
      local_9a4 = local_aa0;
      if (pTVar17->n == (Normal3f *)0x0) {
        if ((pTVar17->reverseOrientation & 1U) != (pTVar17->transformSwapsHandedness & 1U)) {
          Tuple3<pbrt::Normal3,float>::operator*=((Tuple3<pbrt::Normal3,float> *)&local_9ac,-1);
        }
        this_01 = (array<float,_3> *)CONCAT44(in_stack_fffffffffffff0ec,in_stack_fffffffffffff0e8);
      }
      else {
        in_stack_fffffffffffff0e0 = (Interaction *)0x0;
        this_01 = &local_5a0;
        pstd::array<float,_3>::operator[](this_01,0);
        auVar66 = (undefined1  [56])0x0;
        local_af0 = pTVar17->n[*piVar1].super_Tuple3<pbrt::Normal3,_float>.z;
        pNVar3 = pTVar17->n + *piVar1;
        local_af8._0_4_ = (pNVar3->super_Tuple3<pbrt::Normal3,_float>).x;
        local_af8._4_4_ = (pNVar3->super_Tuple3<pbrt::Normal3,_float>).y;
        t_09.y = in_stack_fffffffffffff0cc;
        t_09.x = in_stack_fffffffffffff0c8;
        t_09.z = in_stack_fffffffffffff0d0;
        local_ae8 = local_af8;
        local_ae0 = local_af0;
        NVar74 = pbrt::operator*(in_stack_fffffffffffff0b4,t_09);
        local_b00 = NVar74.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar53._0_8_ = NVar74.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar53._8_56_ = auVar66;
        local_b08 = vmovlpd_avx(auVar53._0_16_);
        in_stack_fffffffffffff0f0 = 1.4013e-45;
        in_stack_fffffffffffff0f4 = 0;
        local_ad8 = local_b08;
        local_ad0 = local_b00;
        pstd::array<float,_3>::operator[](this_01,1);
        auVar66 = (undefined1  [56])0x0;
        local_b30 = pTVar17->n[piVar1[1]].super_Tuple3<pbrt::Normal3,_float>.z;
        pNVar3 = pTVar17->n + piVar1[1];
        local_b38._0_4_ = (pNVar3->super_Tuple3<pbrt::Normal3,_float>).x;
        local_b38._4_4_ = (pNVar3->super_Tuple3<pbrt::Normal3,_float>).y;
        t_10.y = in_stack_fffffffffffff0cc;
        t_10.x = in_stack_fffffffffffff0c8;
        t_10.z = in_stack_fffffffffffff0d0;
        local_b28 = local_b38;
        local_b20 = local_b30;
        NVar74 = pbrt::operator*(in_stack_fffffffffffff0b4,t_10);
        local_b50 = NVar74.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar54._0_8_ = NVar74.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar54._8_56_ = auVar66;
        local_b58 = vmovlpd_avx(auVar54._0_16_);
        auVar66 = ZEXT856(0);
        c_05.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffff0c4;
        c_05.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffff0c0;
        c_05.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff0c8;
        local_b48 = local_b58;
        local_b40 = local_b50;
        local_b18 = local_b58;
        local_b10 = local_b50;
        NVar74 = Tuple3<pbrt::Normal3,float>::operator+
                           ((Tuple3<pbrt::Normal3,_float> *)
                            CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),c_05);
        local_b60 = NVar74.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar55._0_8_ = NVar74.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar55._8_56_ = auVar66;
        local_b68 = vmovlpd_avx(auVar55._0_16_);
        local_ac8 = local_b68;
        local_ac0 = local_b60;
        pstd::array<float,_3>::operator[](this_01,(size_t)in_stack_fffffffffffff0e0);
        pstd::array<float,_3>::operator[]
                  (this_01,CONCAT44(in_stack_fffffffffffff0f4,in_stack_fffffffffffff0f0));
        auVar66 = (undefined1  [56])0x0;
        local_b90 = pTVar17->n[piVar1[2]].super_Tuple3<pbrt::Normal3,_float>.z;
        pNVar3 = pTVar17->n + piVar1[2];
        local_b98._0_4_ = (pNVar3->super_Tuple3<pbrt::Normal3,_float>).x;
        local_b98._4_4_ = (pNVar3->super_Tuple3<pbrt::Normal3,_float>).y;
        t_11.y = in_stack_fffffffffffff0cc;
        t_11.x = in_stack_fffffffffffff0c8;
        t_11.z = in_stack_fffffffffffff0d0;
        local_b88 = local_b98;
        local_b80 = local_b90;
        NVar74 = pbrt::operator*(in_stack_fffffffffffff0b4,t_11);
        local_bb0 = NVar74.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar56._0_8_ = NVar74.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar56._8_56_ = auVar66;
        local_bb8 = vmovlpd_avx(auVar56._0_16_);
        auVar66 = ZEXT856(0);
        c_06.super_Tuple3<pbrt::Normal3,_float>.y = (float)in_stack_fffffffffffff0c4;
        c_06.super_Tuple3<pbrt::Normal3,_float>.x = (float)in_stack_fffffffffffff0c0;
        c_06.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff0c8;
        local_ba8 = local_bb8;
        local_ba0 = local_bb0;
        local_b78 = local_bb8;
        local_b70 = local_bb0;
        NVar74 = Tuple3<pbrt::Normal3,float>::operator+
                           ((Tuple3<pbrt::Normal3,_float> *)
                            CONCAT44(in_stack_fffffffffffff0ac,in_stack_fffffffffffff0a8),c_06);
        local_c08 = NVar74.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar57._0_8_ = NVar74.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar57._8_56_ = auVar66;
        local_c10 = vmovlpd_avx(auVar57._0_16_);
        local_bd8 = local_9a4;
        local_be0 = local_9ac;
        local_bf8 = local_9a4;
        local_c00 = local_9ac;
        auVar66 = ZEXT856(0);
        n_06.super_Tuple3<pbrt::Normal3,_float>.z = fVar76;
        n_06.super_Tuple3<pbrt::Normal3,_float>._0_8_ = puVar81;
        n2.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar79;
        n2.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar78;
        n2.super_Tuple3<pbrt::Normal3,_float>.z = fVar68;
        local_bf0 = local_c10;
        local_be8 = local_c08;
        local_bc8 = local_c10;
        local_bc0 = local_c08;
        local_ab8 = local_c10;
        local_ab0 = local_c08;
        NVar74 = FaceForward<float>(n_06,n2);
        local_c18 = NVar74.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar58._0_8_ = NVar74.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar58._8_56_ = auVar66;
        local_c20 = vmovlpd_avx(auVar58._0_16_);
        local_bd4 = local_c20;
        local_bcc = local_c18;
        local_9ac = local_c20;
        local_9a4 = local_c18;
      }
      if (pTVar17->uv == (Point2f *)0x0) {
        Point2<float>::Point2
                  ((Point2<float> *)CONCAT44(in_stack_fffffffffffff0a4,in_stack_fffffffffffff0a0),
                   (float)((ulong)in_stack_fffffffffffff098 >> 0x20),
                   (float)in_stack_fffffffffffff098);
        Point2<float>::Point2
                  ((Point2<float> *)CONCAT44(in_stack_fffffffffffff0a4,in_stack_fffffffffffff0a0),
                   (float)((ulong)in_stack_fffffffffffff098 >> 0x20),
                   (float)in_stack_fffffffffffff098);
        Point2<float>::Point2
                  ((Point2<float> *)CONCAT44(in_stack_fffffffffffff0a4,in_stack_fffffffffffff0a0),
                   (float)((ulong)in_stack_fffffffffffff098 >> 0x20),
                   (float)in_stack_fffffffffffff098);
        local_c70 = local_c88;
        local_c68 = 3;
        v_13._M_len._0_4_ = in_stack_fffffffffffff0f0;
        v_13._M_array = (iterator)this_01;
        v_13._M_len._4_4_ = in_stack_fffffffffffff0f4;
        pstd::array<pbrt::Point2<float>,_3>::array
                  ((array<pbrt::Point2<float>,_3> *)in_stack_fffffffffffff0e0,v_13);
      }
      else {
        local_c60 = pTVar17->uv[*piVar1].super_Tuple2<pbrt::Point2,_float>;
        local_c58 = pTVar17->uv[piVar1[1]].super_Tuple2<pbrt::Point2,_float>;
        local_c50 = pTVar17->uv[piVar1[2]].super_Tuple2<pbrt::Point2,_float>;
        local_c48 = &local_c60;
        local_c40 = 3;
        v_12._M_len._0_4_ = in_stack_fffffffffffff0f0;
        v_12._M_array = (iterator)this_01;
        v_12._M_len._4_4_ = in_stack_fffffffffffff0f4;
        pstd::array<pbrt::Point2<float>,_3>::array
                  ((array<pbrt::Point2<float>,_3> *)in_stack_fffffffffffff0e0,v_12);
      }
      t_12.x = 0.0;
      t_12.y = 0.0;
      pfVar19 = pstd::array<float,_3>::operator[](&local_5a0,0);
      fVar21 = *pfVar19;
      this_00 = &local_c38;
      pstd::array<pbrt::Point2<float>,_3>::operator[](this_00,(size_t)t_12);
      auVar59._0_8_ = pbrt::operator*(0.0,t_12);
      auVar59._8_56_ = extraout_var_03;
      vmovlpd_avx(auVar59._0_16_);
      fVar75 = 1.4013e-45;
      fVar76 = 0.0;
      pfVar19 = pstd::array<float,_3>::operator[](&local_5a0,1);
      fVar77 = *pfVar19;
      pstd::array<pbrt::Point2<float>,_3>::operator[](this_00,CONCAT44(fVar76,fVar75));
      auVar60._0_8_ = pbrt::operator*(0.0,t_12);
      auVar60._8_56_ = extraout_var_04;
      vmovlpd_avx(auVar60._0_16_);
      c.super_Tuple2<pbrt::Point2,_float>.y = fVar76;
      c.super_Tuple2<pbrt::Point2,_float>.x = fVar75;
      auVar61._0_8_ =
           Tuple2<pbrt::Point2,float>::operator+
                     ((Tuple2<pbrt::Point2,_float> *)CONCAT44(fVar21,in_stack_fffffffffffff0a0),c);
      auVar61._8_56_ = extraout_var_05;
      vmovlpd_avx(auVar61._0_16_);
      uVar78 = 2;
      uVar79 = 0;
      pstd::array<float,_3>::operator[](&local_5a0,2);
      pstd::array<pbrt::Point2<float>,_3>::operator[](this_00,CONCAT44(uVar79,uVar78));
      auVar62._0_8_ = pbrt::operator*(0.0,t_12);
      auVar62._8_56_ = extraout_var_06;
      vmovlpd_avx(auVar62._0_16_);
      c_00.super_Tuple2<pbrt::Point2,_float>.y = fVar76;
      c_00.super_Tuple2<pbrt::Point2,_float>.x = fVar75;
      auVar63._0_8_ =
           Tuple2<pbrt::Point2,float>::operator+
                     ((Tuple2<pbrt::Point2,_float> *)CONCAT44(fVar21,in_stack_fffffffffffff0a0),c_00
                     );
      auVar63._8_56_ = extraout_var_07;
      vmovlpd_avx(auVar63._0_16_);
      p_06.super_Tuple3<pbrt::Point3,_float>.z = in_stack_fffffffffffff0f0;
      p_06.super_Tuple3<pbrt::Point3,_float>._0_8_ = this_01;
      e.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar79;
      e.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar78;
      e.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffff0d0;
      Point3fi::Point3fi((Point3fi *)CONCAT44(fVar77,in_stack_fffffffffffff0b0),p_06,e);
      n_00.super_Tuple3<pbrt::Normal3,_float>.y = (float)uVar79;
      n_00.super_Tuple3<pbrt::Normal3,_float>.x = (float)uVar78;
      n_00.super_Tuple3<pbrt::Normal3,_float>.z = in_stack_fffffffffffff0d0;
      uv_00.super_Tuple2<pbrt::Point2,_float>.y = fVar77;
      uv_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff0b0;
      Interaction::Interaction
                ((Interaction *)CONCAT44(fVar76,fVar75),
                 (Point3fi *)CONCAT44(fVar21,in_stack_fffffffffffff0a0),n_00,t_12.y,uv_00);
      pstd::optional<pbrt::ShapeSample>::optional
                ((optional<pbrt::ShapeSample> *)CONCAT44(fVar21,in_stack_fffffffffffff0a0),
                 (ShapeSample *)t_12);
    }
    else {
      memset(in_RDI,0,0x60);
      pstd::optional<pbrt::ShapeSample>::optional(in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const ShapeSampleContext &ctx, Point2f u) const {
        // Get triangle vertices in _p0_, _p1_, and _p2_
        const TriangleMesh *mesh = GetMesh();
        const int *v = &mesh->vertexIndices[3 * triIndex];
        Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

        // Use uniform area sampling for numerically unstable cases
        Float solidAngle = SolidAngle(ctx.p());
        if (solidAngle < MinSphericalSampleArea || solidAngle > MaxSphericalSampleArea) {
            // Sample shape by area and compute incident direction _wi_
            pstd::optional<ShapeSample> ss = Sample(u);
            DCHECK(ss.has_value());
            ss->intr.time = ctx.time;
            Vector3f wi = ss->intr.p() - ctx.p();
            if (LengthSquared(wi) == 0)
                return {};
            wi = Normalize(wi);

            // Convert area sampling PDF in _ss_ to solid angle measure
            ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
            if (IsInf(ss->pdf))
                return {};

            return ss;
        }

        // Sample spherical triangle from reference point
        // Apply warp product sampling for cosine factor at reference point
        Float pdf = 1;
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Compute $\cos\theta$-based weights _w_ at sample domain corners
            Point3f rp = ctx.p();
            Vector3f wi[3] = {Normalize(p0 - rp), Normalize(p1 - rp), Normalize(p2 - rp)};
            pstd::array<Float, 4> w =
                pstd::array<Float, 4>{std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[0])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[2]))};

            u = SampleBilinear(u, w);
            DCHECK(u[0] >= 0 && u[0] < 1 && u[1] >= 0 && u[1] < 1);
            pdf = BilinearPDF(u, w);
        }

        Float triPDF;
        pstd::array<Float, 3> b =
            SampleSphericalTriangle({p0, p1, p2}, ctx.p(), u, &triPDF);
        if (triPDF == 0)
            return {};
        pdf *= triPDF;

        // Compute error bounds _pError_ for sampled point on triangle
        Point3f pAbsSum = Abs(b[0] * p0) + Abs(b[1] * p1) + Abs((1 - b[0] - b[1]) * p2);
        Vector3f pError = Vector3f(gamma(6) * pAbsSum);

        // Return _ShapeSample_ for solid angle sampled point on triangle
        Point3f p = b[0] * p0 + b[1] * p1 + b[2] * p2;
        // Compute surface normal for sampled point on triangle
        Normal3f n = Normalize(Normal3f(Cross(p1 - p0, p2 - p0)));
        if (mesh->n) {
            Normal3f ns(b[0] * mesh->n[v[0]] + b[1] * mesh->n[v[1]] +
                        (1 - b[0] - b[1]) * mesh->n[v[2]]);
            n = FaceForward(n, ns);
        } else if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;

        // Compute $(u,v)$ for sampled point on triangle
        // Get triangle texture coordinates in _uv_ array
        pstd::array<Point2f, 3> uv =
            mesh->uv
                ? pstd::array<Point2f, 3>(
                      {mesh->uv[v[0]], mesh->uv[v[1]], mesh->uv[v[2]]})
                : pstd::array<Point2f, 3>({Point2f(0, 0), Point2f(1, 0), Point2f(1, 1)});

        Point2f uvSample = b[0] * uv[0] + b[1] * uv[1] + b[2] * uv[2];

        return ShapeSample{Interaction(Point3fi(p, pError), n, ctx.time, uvSample), pdf};
    }